

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O1

WW<127UL> * __thiscall GF2::WW<127UL>::operator=(WW<127UL> *this,word wRight)

{
  this->_words[0] = wRight;
  this->_words[1] = 0;
  return this;
}

Assistant:

WW& operator=(word wRight)
	{	
		_words[0] = wRight;
		for (size_t pos = 1; pos < _wcount; pos++)
			_words[pos] = 0;
		Trim();
		return *this;
	}